

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util_test.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::TimeUtilTest_DurationBounds_Test::TestBody
          (TimeUtilTest_DurationBounds_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  DeathTest DVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  DeathTest *gtest_dt;
  ReturnSentinel gtest_sentinel;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffcd0;
  Duration underflow;
  Duration overflow;
  Duration underflow_nanos;
  Duration overflow_nanos;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_270;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_258;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_240;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_228;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_210;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1f8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1e0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1c8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1b0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_198;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_180;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_168;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_150;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_138;
  Duration local_120;
  Duration local_f8;
  Duration local_d0;
  Duration local_a8;
  Duration local_80;
  Duration local_58;
  
  Duration::Duration(&overflow);
  overflow.field_0._impl_.seconds_ = 0x4979cb9e01;
  overflow.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       overflow.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  Duration::Duration(&underflow);
  underflow.field_0._impl_.seconds_ = -0x4979cb9e01;
  underflow.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       underflow.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  Duration::Duration(&overflow_nanos);
  overflow_nanos.field_0._impl_.nanos_ = 1000000000;
  overflow_nanos.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       overflow_nanos.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  Duration::Duration(&underflow_nanos);
  underflow_nanos.field_0._impl_.nanos_ = -1000000000;
  underflow_nanos.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       underflow_nanos.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(overflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_138,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ad,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_138);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00951f51;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00951f51;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::SecondsToDuration(&local_58,overflow.field_0._impl_.seconds_);
          Duration::~Duration(&local_58);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00951fa2;
    }
  }
  else {
LAB_00951f51:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ad,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )_Var6._M_head_impl !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00951fa2:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::SecondsToDuration(underflow.seconds()); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_150,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1af,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_150);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_009520a4;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_009520a4;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::SecondsToDuration(&local_80,underflow.field_0._impl_.seconds_);
          Duration::~Duration(&local_80);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_009520f5;
    }
  }
  else {
LAB_009520a4:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1af,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_009520f5:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_168,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b2,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_168);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952203;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952203;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::MinutesToDuration(&local_a8,overflow.field_0._impl_.seconds_ / 0x3c + 1);
          Duration::~Duration(&local_a8);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00952254;
    }
  }
  else {
LAB_00952203:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b2,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00952254:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_180,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b5,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_180);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_0095235f;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_0095235f;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::MinutesToDuration(&local_d0,underflow.field_0._impl_.seconds_ / 0x3c + -1);
          Duration::~Duration(&local_d0);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_009523b0;
    }
  }
  else {
LAB_0095235f:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b5,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_009523b0:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_198,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1b8,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_198);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_009524bb;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_009524bb;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::HoursToDuration(&local_f8,overflow.field_0._impl_.seconds_ / 0x3c + 1);
          Duration::~Duration(&local_f8);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_0095250c;
    }
  }
  else {
LAB_009524bb:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1b8,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_0095250c:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1bb,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1b0);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952617;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952617;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::HoursToDuration(&local_120,underflow.field_0._impl_.seconds_ / 0x3c + -1);
          Duration::~Duration(&local_120);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00952668;
    }
  }
  else {
LAB_00952617:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1bb,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00952668:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1be,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1c8);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952755;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952755;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&overflow);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_009527a6;
    }
  }
  else {
LAB_00952755:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1be,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_009527a6:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1e0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c0,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1e0);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952893;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952893;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&underflow);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_009528e4;
    }
  }
  else {
LAB_00952893:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c0,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_009528e4:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_1f8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c2,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_1f8);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_009529d4;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_009529d4;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&overflow_nanos);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00952a25;
    }
  }
  else {
LAB_009529d4:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c2,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00952a25:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToNanoseconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_210,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c4,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_210);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952b15;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952b15;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToNanoseconds(&underflow_nanos);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00952b66;
    }
  }
  else {
LAB_00952b15:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c4,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00952b66:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_228,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c6,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_228);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952c53;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952c53;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToSeconds(&overflow);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00952ca4;
    }
  }
  else {
LAB_00952c53:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c6,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00952ca4:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_240,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1c8,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_240);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952d91;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952d91;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToSeconds(&underflow);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00952de2;
    }
  }
  else {
LAB_00952d91:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1c8,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00952de2:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(overflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_258,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1ca,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_258);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00952ed2;
    if (gtest_dt != (DeathTest *)0x0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
      pDVar1 = gtest_dt;
      if (iVar3 == 0) {
        iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
        iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
        if ((char)iVar3 == '\0') {
          (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
          goto LAB_00952ed2;
        }
      }
      else if (iVar3 == 1) {
        gtest_sentinel.test_ = gtest_dt;
        bVar2 = testing::internal::AlwaysTrue();
        if (bVar2) {
          TimeUtil::DurationToSeconds(&overflow_nanos);
        }
        (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
      goto LAB_00952f23;
    }
  }
  else {
LAB_00952ed2:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1ca,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    in_stack_fffffffffffffcd0._M_head_impl = _Var6._M_head_impl;
    if (_Var6._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
LAB_00952f23:
      (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((char *)in_stack_fffffffffffffcd0._M_head_impl);
    bVar2 = testing::internal::DeathTest::Create
                      ("{ TimeUtil::DurationToSeconds(underflow_nanos); }",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_270,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
                       ,0x1cc,&gtest_dt);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_270);
    _Var6._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_dt;
    if (!bVar2) goto LAB_00953013;
    if (gtest_dt == (DeathTest *)0x0) goto LAB_00953067;
    iVar3 = (*gtest_dt->_vptr_DeathTest[2])(gtest_dt);
    if (iVar3 == 0) {
      iVar3 = (*gtest_dt->_vptr_DeathTest[3])(gtest_dt);
      bVar2 = testing::internal::ExitedUnsuccessfully(iVar3);
      iVar3 = (*gtest_dt->_vptr_DeathTest[4])(gtest_dt,(ulong)bVar2);
      if ((char)iVar3 == '\0') {
        (*((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest[1])(_Var6._M_head_impl);
        goto LAB_00953013;
      }
    }
    else if (iVar3 == 1) {
      gtest_sentinel.test_ = gtest_dt;
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        TimeUtil::DurationToSeconds(&underflow_nanos);
      }
      (*gtest_dt->_vptr_DeathTest[5])(gtest_dt,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
    }
    DVar5 = (DeathTest)((DeathTest *)_Var6._M_head_impl)->_vptr_DeathTest;
  }
  else {
LAB_00953013:
    _Var6._M_head_impl = in_stack_fffffffffffffcd0._M_head_impl;
    testing::Message::Message((Message *)&stack0xfffffffffffffcd0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/time_util_test.cc"
               ,0x1cc,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_dt,(Message *)&stack0xfffffffffffffcd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )_Var6._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00953067;
    DVar5._vptr_DeathTest = *(_func_int ***)_Var6._M_head_impl;
  }
  (*DVar5._vptr_DeathTest[1])(_Var6._M_head_impl);
LAB_00953067:
  Duration::~Duration(&underflow_nanos);
  Duration::~Duration(&overflow_nanos);
  Duration::~Duration(&underflow);
  Duration::~Duration(&overflow);
  return;
}

Assistant:

TEST(TimeUtilTest, DurationBounds) {
  Duration overflow;
  overflow.set_seconds(TimeUtil::kDurationMaxSeconds + 1);
  Duration underflow;
  underflow.set_seconds(TimeUtil::kDurationMinSeconds - 1);
  Duration overflow_nanos;
  overflow_nanos.set_nanos(TimeUtil::kDurationMaxNanoseconds + 1);
  Duration underflow_nanos;
  underflow_nanos.set_nanos(TimeUtil::kDurationMinNanoseconds - 1);

  EXPECT_DEATH({ TimeUtil::SecondsToDuration(overflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH({ TimeUtil::SecondsToDuration(underflow.seconds()); },
                     "Duration seconds");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(overflow.seconds() / 60 + 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::MinutesToDuration(underflow.seconds() / 60 - 1); },
      "Duration minutes");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(overflow.seconds() / 60 + 1); },
      "Duration hours");
  EXPECT_DEATH(
      { TimeUtil::HoursToDuration(underflow.seconds() / 60 - 1); },
      "Duration hours");

  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToNanoseconds(underflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(overflow_nanos); },
                     "outside of the valid range");
  EXPECT_DEATH({ TimeUtil::DurationToSeconds(underflow_nanos); },
                     "outside of the valid range");
}